

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

opvar * opvar_clone(opvar *ov)

{
  byte bVar1;
  char *__s;
  int iVar2;
  opvar *poVar3;
  size_t sVar4;
  char *__dest;
  
  poVar3 = (opvar *)malloc(0x10);
  if (poVar3 == (opvar *)0x0) {
    panic("could not alloc opvar struct");
  }
  bVar1 = ov->spovartyp;
  if (bVar1 < 10) {
    if ((0x1f2U >> (bVar1 & 0x1f) & 1) != 0) {
      poVar3->spovartyp = bVar1;
      poVar3->vardata = ov->vardata;
      return poVar3;
    }
    if ((0x20cU >> (bVar1 & 0x1f) & 1) != 0) {
      __s = (ov->vardata).str;
      sVar4 = strlen(__s);
      poVar3->spovartyp = bVar1;
      iVar2 = (int)sVar4;
      __dest = (char *)malloc((long)(iVar2 + 1));
      (poVar3->vardata).str = __dest;
      memcpy(__dest,__s,(long)iVar2);
      __dest[iVar2] = '\0';
      return poVar3;
    }
  }
  impossible("Unknown push value type (%i)!",(ulong)(uint)(int)(char)bVar1);
  return poVar3;
}

Assistant:

static struct opvar *opvar_clone(struct opvar *ov)
{
	struct opvar *tmpov = malloc(sizeof(struct opvar));
	if (!tmpov) panic("could not alloc opvar struct");

	switch (ov->spovartyp) {
	case SPOVAR_COORD:
	case SPOVAR_REGION:
	case SPOVAR_MAPCHAR:
	case SPOVAR_MONST:
	case SPOVAR_OBJ:
	case SPOVAR_INT:
	    {
		tmpov->spovartyp = ov->spovartyp;
		tmpov->vardata.l = ov->vardata.l;
	    }
	    break;
	case SPOVAR_VARIABLE:
	case SPOVAR_STRING:
	case SPOVAR_SEL:
	    {
		int len = strlen(ov->vardata.str);
		tmpov->spovartyp = ov->spovartyp;
		tmpov->vardata.str = malloc(len + 1);
		memcpy(tmpov->vardata.str, ov->vardata.str, len);
		tmpov->vardata.str[len] = '\0';
	    }
	    break;
	default:
	    impossible("Unknown push value type (%i)!", ov->spovartyp);
	}

	return tmpov;
}